

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HDFHDD.cpp
# Opt level: O2

bool __thiscall
HDFHDD::Create(HDFHDD *this,string *path,uint64_t total_bytes_,IDENTIFYDEVICE *pIdentify_,
              bool fOverwrite_)

{
  bool bVar1;
  int iVar2;
  ssize_t sVar3;
  allocator<char> local_69;
  RS_IDE sHeader;
  string local_48;
  
  bVar1 = false;
  iVar2 = open64((path->_M_dataplus)._M_p,(uint)!fOverwrite_ << 7 | 0x42,0x180);
  (this->super_HDD).h = iVar2;
  if (iVar2 != -1) {
    (this->super_HDD).sector_size = 0x200;
    (this->super_HDD).data_offset = 0;
    (this->super_HDD).total_bytes = total_bytes_;
    (this->super_HDD).total_sectors = total_bytes_ >> 9 & 0xffffffff;
    if ((pIdentify_ == (IDENTIFYDEVICE *)0x0) || (pIdentify_->len != 0x204)) {
      pIdentify_ = (IDENTIFYDEVICE *)0x0;
    }
    HDD::SetIdentifyData(&this->super_HDD,pIdentify_);
    builtin_strncpy(sHeader.szSignature,"RS-IDE",6);
    sHeader.bEOF = '\x1a';
    sHeader.bRevision = '\x10';
    sHeader.bFlags = '\0';
    sHeader.bOffsetLow = '\0';
    sHeader.bOffsetHigh = '\0';
    sHeader.abReserved[0] = '\0';
    sHeader.abReserved[1] = '\0';
    sHeader.abReserved[2] = '\0';
    sHeader.abReserved[3] = '\0';
    sHeader.abReserved[4] = '\0';
    sHeader.abReserved[5] = '\0';
    sHeader.abReserved[6] = '\0';
    sHeader.abReserved[7] = '\0';
    sHeader.abReserved[8] = '\0';
    sHeader.abReserved[9] = '\0';
    sHeader.abReserved[10] = '\0';
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"hdf",&local_69);
    bVar1 = IsFileExt(path,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    if (bVar1) {
      if (opt.hdf == 10) {
        (this->super_HDD).sIdentify.len = 0x6a;
        iVar2 = 0x80;
      }
      else {
        sHeader.bRevision = '\x11';
        iVar2 = (this->super_HDD).sIdentify.len + 0x16;
      }
      (this->super_HDD).data_offset = iVar2;
      sHeader.bOffsetLow = (uint8_t)iVar2;
      sHeader.bOffsetHigh = (uint8_t)((uint)iVar2 >> 8);
    }
    else {
      iVar2 = (this->super_HDD).data_offset;
    }
    bVar1 = true;
    if ((iVar2 != 0) &&
       ((sVar3 = write((this->super_HDD).h,&sHeader,0x16), sVar3 != 0x16 ||
        (sVar3 = write((this->super_HDD).h,&(this->super_HDD).sIdentify.field_1,
                       (long)(this->super_HDD).sIdentify.len),
        sVar3 != (this->super_HDD).sIdentify.len)))) {
      close((this->super_HDD).h);
      (this->super_HDD).h = -1;
      unlink((path->_M_dataplus)._M_p);
      bVar1 = false;
    }
  }
  return bVar1;
}

Assistant:

bool HDFHDD::Create(const std::string& path, uint64_t total_bytes_, const IDENTIFYDEVICE* pIdentify_, bool fOverwrite_/*=false*/)
{
    bool fRet = true;

    if ((h = open(path.c_str(), O_CREAT | O_RDWR | O_SEQUENTIAL | O_BINARY | (fOverwrite_ ? 0 : O_EXCL), S_IREAD | S_IWRITE)) == -1)
        return false;

    // Set the new disk geometry
    data_offset = 0;
    sector_size = SECTOR_SIZE;
    total_bytes = total_bytes_;
    total_sectors = static_cast<unsigned>(total_bytes_ / sector_size);

    // Preserve the source identify data if it's complete, otherwise generate new
    if (pIdentify_ && pIdentify_->len == sizeof(*pIdentify_))
        SetIdentifyData(pIdentify_);
    else
        SetIdentifyData();

    // HDF v1.0 header
    RS_IDE sHeader = { {'R','S','-','I','D','E'}, 0x1a, 0x10, 0x00, 0,0, {} };

    // Are we creating an HDF image?
    if (IsFileExt(path, "hdf"))
    {
        // Are we forced to use HDF v1.0?
        if (opt.hdf == 10)
        {
            // v1.0 has a 128-byte limit for the header+identify data
            sIdentify.len = 128 - sizeof(RS_IDE);
        }
        else
        {
            // v1.1 preserves all identify data, and has a new version number
            sHeader.bRevision = 0x11;
        }

        // Complete the HDD data offset now it's known
        data_offset = sizeof(RS_IDE) + sIdentify.len;
        sHeader.bOffsetLow = data_offset & 0xff;
        sHeader.bOffsetHigh = static_cast<uint8_t>(data_offset >> 8);
    }

#ifdef _WIN32
    HANDLE hfile = reinterpret_cast<HANDLE>(_get_osfhandle(h));

    // Ensure there's space for the full file, then truncate and write just the header
    if (_lseeki64(h, total_bytes + data_offset, SEEK_SET) != static_cast<int64_t>(total_bytes + data_offset) ||
        !SetEndOfFile(hfile) ||
        _lseeki64(h, 0, SEEK_SET) != 0 ||
        !SetEndOfFile(hfile))
        fRet = false;
#endif

    // If this is an HDF image, write the header and identity data
    if (fRet && data_offset &&
        (write(h, &sHeader, sizeof(sHeader)) != sizeof(sHeader) ||
            write(h, sIdentify.byte, sIdentify.len) != static_cast<int>(sIdentify.len)))
        fRet = false;

    // If anything went wrong, delete the (possibly partial) file
    if (!fRet)
    {
        close(h);
        h = -1;

        unlink(path.c_str());
    }

    return fRet;
}